

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

ProString * __thiscall ProFile::getStr(ProFile *this,ushort **tPtr)

{
  ushort uVar1;
  ushort *puVar2;
  QString *pQVar3;
  long *in_RDX;
  ProFile *in_RSI;
  ProString *in_RDI;
  uint len;
  ProString *ret;
  QString *str;
  
  puVar2 = (ushort *)*in_RDX;
  *in_RDX = (long)(puVar2 + 1);
  uVar1 = *puVar2;
  memset(in_RDI,0xaa,0x30);
  pQVar3 = items(in_RSI);
  str = (QString *)*in_RDX;
  tokPtr((ProFile *)0x3305e0);
  ProString::ProString((ProString *)in_RSI,str,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
  ProString::setSource(in_RDI,in_RSI->m_id);
  *in_RDX = *in_RDX + (ulong)uVar1 * 2;
  return in_RDI;
}

Assistant:

ProString ProFile::getStr(const ushort *&tPtr)
{
    uint len = *tPtr++;
    ProString ret(items(), tPtr - tokPtr(), len);
    ret.setSource(m_id);
    tPtr += len;
    return ret;
}